

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_time.c
# Opt level: O1

int amqp_time_has_past(amqp_time_t time)

{
  int iVar1;
  ulong uVar2;
  timespec tp;
  timespec local_18;
  
  if (time.time_point_ns == 0xffffffffffffffff) {
    return 0;
  }
  iVar1 = clock_gettime(1,&local_18);
  if (iVar1 == -1) {
    uVar2 = 0;
  }
  else {
    uVar2 = local_18.tv_sec * 1000000000 + local_18.tv_nsec;
  }
  if (uVar2 == 0) {
    iVar1 = -0xe;
  }
  else {
    iVar1 = -0xd;
    if (uVar2 <= time.time_point_ns) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int amqp_time_has_past(amqp_time_t time) {
  uint64_t now_ns;
  if (UINT64_MAX == time.time_point_ns) {
    return AMQP_STATUS_OK;
  }

  now_ns = amqp_get_monotonic_timestamp();
  if (0 == now_ns) {
    return AMQP_STATUS_TIMER_FAILURE;
  }

  if (now_ns > time.time_point_ns) {
    return AMQP_STATUS_TIMEOUT;
  }
  return AMQP_STATUS_OK;
}